

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_table_concat(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef TVar2;
  TRef TVar3;
  TRef TVar4;
  TRef local_6c;
  uint local_68;
  uint local_64;
  TRef tr;
  TRef hdr;
  TRef tre;
  TRef tri;
  TRef sep;
  TRef tab;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  uVar1 = *J->base;
  if ((uVar1 & 0x1f000000) == 0xb000000) {
    if ((J->base[1] & 0x1f000000) == 0) {
      local_64 = lj_ir_knull(J,IRT_STR);
    }
    else {
      local_64 = lj_ir_tostr(J,J->base[1]);
    }
    if ((J->base[1] == 0) || ((J->base[2] & 0x1f000000) == 0)) {
      local_68 = lj_ir_kint(J,1);
    }
    else {
      local_68 = lj_opt_narrow_toint(J,J->base[2]);
    }
    if (((J->base[1] == 0) || (J->base[2] == 0)) || ((J->base[3] & 0x1f000000) == 0)) {
      (J->fold).ins.field_0.ot = 0x4913;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
      (J->fold).ins.field_0.op2 = 0x7fff;
      local_6c = lj_opt_fold(J);
    }
    else {
      local_6c = lj_opt_narrow_toint(J,J->base[3]);
    }
    TVar2 = recff_bufhdr(J);
    TVar3 = lj_ir_call(J,IRCALL_lj_buf_puttab,(ulong)TVar2,(ulong)uVar1,(ulong)local_64,
                       (ulong)local_68,local_6c);
    TVar4 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
    (J->fold).ins.field_0.ot = 0x989;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x5784;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar2 = lj_opt_fold(J);
    *J->base = TVar2;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_concat(jit_State *J, RecordFFData *rd)
{
  TRef tab = J->base[0];
  if (tref_istab(tab)) {
    TRef sep = !tref_isnil(J->base[1]) ?
	       lj_ir_tostr(J, J->base[1]) : lj_ir_knull(J, IRT_STR);
    TRef tri = (J->base[1] && !tref_isnil(J->base[2])) ?
	       lj_opt_narrow_toint(J, J->base[2]) : lj_ir_kint(J, 1);
    TRef tre = (J->base[1] && J->base[2] && !tref_isnil(J->base[3])) ?
	       lj_opt_narrow_toint(J, J->base[3]) :
	       emitir(IRTI(IR_ALEN), tab, TREF_NIL);
    TRef hdr = recff_bufhdr(J);
    TRef tr = lj_ir_call(J, IRCALL_lj_buf_puttab, hdr, tab, sep, tri, tre);
    emitir(IRTG(IR_NE, IRT_PTR), tr, lj_ir_kptr(J, NULL));
    J->base[0] = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
  }  /* else: Interpreter will throw. */
  UNUSED(rd);
}